

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O1

bool MeCab::Viterbi::initPartial(Lattice *lattice)

{
  long lVar1;
  _func_int **pp_Var2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  size_t sVar6;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  char *pcVar7;
  undefined4 extraout_var_06;
  char *pcVar8;
  size_type sVar9;
  char **__n;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *__buf;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *pcVar10;
  _func_int **pp_Var11;
  ulong uVar12;
  size_type __n_00;
  long lVar13;
  _func_int **pp_Var14;
  long lVar15;
  size_type sVar16;
  bool bVar17;
  vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_> tokens;
  StringBuffer os;
  vector<char_*,_std::allocator<char_*>_> lines;
  char *column [2];
  vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_> local_b8;
  pair<char_*,_char_*> local_a0;
  StringBuffer local_90;
  void *local_68;
  iterator iStack_60;
  char **local_58;
  char *local_48 [3];
  
  iVar4 = (*lattice->_vptr_Lattice[0x12])(lattice,4);
  if ((char)iVar4 == '\0') {
    iVar4 = (*lattice->_vptr_Lattice[0x1e])(lattice);
    if ((char)iVar4 != '\0') {
      (*lattice->_vptr_Lattice[0x21])(lattice,0,1);
      iVar4 = (*lattice->_vptr_Lattice[0xb])(lattice);
      (*lattice->_vptr_Lattice[0x21])(lattice,CONCAT44(extraout_var_04,iVar4),1);
    }
  }
  else {
    iVar4 = (*lattice->_vptr_Lattice[0x16])();
    iVar5 = (*lattice->_vptr_Lattice[0xb])(lattice);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)(CONCAT44(extraout_var,iVar4) + 0x50),
               CONCAT44(extraout_var_00,iVar5) + 1);
    pp_Var11 = *(_func_int ***)(CONCAT44(extraout_var,iVar4) + 0x50);
    iVar4 = (*lattice->_vptr_Lattice[8])(lattice);
    iVar5 = (*lattice->_vptr_Lattice[0xb])(lattice);
    strncpy((char *)pp_Var11,(char *)CONCAT44(extraout_var_01,iVar4),
            CONCAT44(extraout_var_02,iVar5) + 1);
    local_68 = (void *)0x0;
    iStack_60._M_current = (char **)0x0;
    local_58 = (char **)0x0;
    iVar4 = (*lattice->_vptr_Lattice[0xb])(lattice);
    local_90._vptr_StringBuffer = pp_Var11;
    sVar6 = strlen((char *)pp_Var11);
    sVar9 = CONCAT44(extraout_var_03,iVar4) + 1;
    if (sVar9 == 0) {
      __n_00 = 0;
    }
    else {
      pp_Var11 = (_func_int **)((long)pp_Var11 + sVar6);
      pp_Var2 = local_90._vptr_StringBuffer;
      sVar16 = 0;
      do {
        for (; (pp_Var14 = pp_Var11, pp_Var2 != pp_Var11 &&
               (pp_Var14 = pp_Var2, *(char *)pp_Var2 != '\n'));
            pp_Var2 = (_func_int **)((long)pp_Var2 + 1)) {
        }
        *(char *)pp_Var14 = '\0';
        if (iStack_60._M_current == local_58) {
          std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                    ((vector<char*,std::allocator<char*>> *)&local_68,iStack_60,(char **)&local_90);
        }
        else {
          *iStack_60._M_current = (char *)local_90._vptr_StringBuffer;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
        __n_00 = sVar16 + 1;
      } while ((pp_Var14 != pp_Var11) &&
              (local_90._vptr_StringBuffer = (_func_int **)((long)pp_Var14 + 1),
              bVar17 = sVar16 != CONCAT44(extraout_var_03,iVar4), __n_00 = sVar9,
              pp_Var2 = local_90._vptr_StringBuffer, sVar16 = sVar16 + 1, bVar17));
    }
    iVar4 = (*lattice->_vptr_Lattice[0xb])(lattice);
    pcVar7 = (char *)operator_new__(CONCAT44(extraout_var_05,iVar4) + 1);
    iVar4 = (*lattice->_vptr_Lattice[0xb])(lattice);
    local_90.alloc_size_ = CONCAT44(extraout_var_06,iVar4) + 1;
    local_90._vptr_StringBuffer = (_func_int **)&PTR__StringBuffer_0019e358;
    __n = (char **)0x0;
    local_90.size_ = 0;
    local_90.is_delete_ = false;
    local_90.error_ = false;
    local_b8.
    super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<char_*,_char_*> *)0x0;
    local_b8.
    super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pair<char_*,_char_*> *)0x0;
    local_b8.
    super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pair<char_*,_char_*> *)0x0;
    local_90.ptr_ = pcVar7;
    std::vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>::reserve
              (&local_b8,__n_00);
    pcVar10 = extraout_RDX;
    if (__n_00 != 0) {
      sVar9 = 0;
      do {
        pcVar10 = *(char **)((long)local_68 + sVar9 * 8);
        sVar6 = strlen(pcVar10);
        pcVar8 = pcVar10 + sVar6;
        lVar15 = 0;
        __n = local_48;
        __buf = extraout_RDX_00;
        do {
          pcVar3 = pcVar10;
          if (lVar15 == 2) {
            lVar15 = 2;
            break;
          }
          for (; (__buf = pcVar8, pcVar3 != pcVar8 && (__buf = pcVar3, *pcVar3 != '\t'));
              pcVar3 = pcVar3 + 1) {
          }
          *__buf = '\0';
          *__n = pcVar10;
          __n = __n + 1;
          lVar15 = lVar15 + 1;
          pcVar10 = __buf + 1;
        } while (__buf != pcVar8);
        if ((lVar15 == 1) &&
           (iVar4 = strcmp(local_48[0],"EOS"), __buf = extraout_RDX_01, iVar4 == 0)) {
          bVar17 = true;
          pcVar10 = extraout_RDX_01;
        }
        else {
          pcVar10 = local_48[0];
          if (lVar15 == 2) {
            local_a0.first = local_48[0];
            local_a0.second = local_48[1];
            if (local_b8.
                super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_b8.
                super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<char*,char*>,std::allocator<std::pair<char*,char*>>>::
              _M_realloc_insert<std::pair<char*,char*>>
                        ((vector<std::pair<char*,char*>,std::allocator<std::pair<char*,char*>>> *)
                         &local_b8,
                         (iterator)
                         local_b8.
                         super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_a0);
              __buf = extraout_RDX_02;
            }
            else {
LAB_00153035:
              local_a0.first = local_48[0];
              (local_b8.
               super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = local_48[0];
              (local_b8.
               super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = local_a0.second;
              local_b8.
              super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_b8.
                   super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            local_a0.first = local_48[0];
            local_a0.second = (char *)0x0;
            if (local_b8.
                super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_b8.
                super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00153035;
            std::vector<std::pair<char*,char*>,std::allocator<std::pair<char*,char*>>>::
            _M_realloc_insert<std::pair<char*,char*>>
                      ((vector<std::pair<char*,char*>,std::allocator<std::pair<char*,char*>>> *)
                       &local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_a0);
            __buf = extraout_RDX_03;
          }
          StringBuffer::write(&local_90,(int)pcVar10,__buf,(size_t)__n);
          bVar17 = false;
          pcVar10 = extraout_RDX_04;
        }
      } while ((!bVar17) && (sVar9 = sVar9 + 1, sVar9 != __n_00));
    }
    StringBuffer::write(&local_90,0,pcVar10,(size_t)__n);
    pcVar10 = local_90.ptr_;
    if (local_90.error_ != false) {
      pcVar10 = (char *)0x0;
    }
    (*lattice->_vptr_Lattice[9])(lattice,pcVar10);
    if (local_b8.
        super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_b8.
        super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar12 = 0;
      lVar15 = 0;
      do {
        pcVar10 = local_b8.
                  super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar12].second;
        sVar6 = strlen(local_b8.
                       super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12].first);
        (*lattice->_vptr_Lattice[0x21])(lattice,lVar15,1);
        lVar1 = sVar6 + lVar15;
        (*lattice->_vptr_Lattice[0x21])(lattice,lVar1,1);
        if ((pcVar10 != (char *)0x0) &&
           ((*lattice->_vptr_Lattice[0x22])(lattice,lVar15,lVar1,pcVar10), 1 < sVar6)) {
          lVar13 = sVar6 - 1;
          do {
            lVar15 = lVar15 + 1;
            (*lattice->_vptr_Lattice[0x21])(lattice,lVar15,2);
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
        }
        uVar12 = uVar12 + 1;
        lVar15 = lVar1;
      } while (uVar12 < (ulong)((long)local_b8.
                                      super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_b8.
                                      super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    if (local_b8.
        super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pair<char_*,_char_*> *)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    StringBuffer::~StringBuffer(&local_90);
    operator_delete__(pcVar7);
    if (local_68 != (void *)0x0) {
      operator_delete(local_68);
    }
  }
  return true;
}

Assistant:

bool Viterbi::initPartial(Lattice *lattice) {
  if (!lattice->has_request_type(MECAB_PARTIAL)) {
    if (lattice->has_constraint()) {
      lattice->set_boundary_constraint(0, MECAB_TOKEN_BOUNDARY);
      lattice->set_boundary_constraint(lattice->size(),
                                       MECAB_TOKEN_BOUNDARY);
    }
    return true;
  }

  Allocator<Node, Path> *allocator = lattice->allocator();
  char *str = allocator->partial_buffer(lattice->size() + 1);
  strncpy(str, lattice->sentence(), lattice->size() + 1);

  std::vector<char *> lines;
  const size_t lsize = tokenize(str, "\n",
                                std::back_inserter(lines),
                                lattice->size() + 1);
  char* column[2];
  scoped_array<char> buf(new char[lattice->size() + 1]);
  StringBuffer os(buf.get(), lattice->size() + 1);

  std::vector<std::pair<char *, char *> > tokens;
  tokens.reserve(lsize);

  size_t pos = 0;
  for (size_t i = 0; i < lsize; ++i) {
    const size_t size = tokenize(lines[i], "\t", column, 2);
    if (size == 1 && std::strcmp(column[0], "EOS") == 0) {
      break;
    }
    const size_t len = std::strlen(column[0]);
    if (size == 2) {
      tokens.push_back(std::make_pair(column[0], column[1]));
    } else {
      tokens.push_back(std::make_pair(column[0], reinterpret_cast<char *>(0)));
    }
    os << column[0];
    pos += len;
  }

  os << '\0';

  lattice->set_sentence(os.str());

  pos = 0;
  for (size_t i = 0; i < tokens.size(); ++i) {
    const char *surface = tokens[i].first;
    const char *feature = tokens[i].second;
    const size_t len = std::strlen(surface);
    lattice->set_boundary_constraint(pos, MECAB_TOKEN_BOUNDARY);
    lattice->set_boundary_constraint(pos + len, MECAB_TOKEN_BOUNDARY);
    if (feature) {
      lattice->set_feature_constraint(pos, pos + len, feature);
      for (size_t n = 1; n < len; ++n) {
        lattice->set_boundary_constraint(pos + n,
                                         MECAB_INSIDE_TOKEN);
      }
    }
    pos += len;
  }

  return true;
}